

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void google::protobuf::compiler::cpp::anon_unknown_0::PrintPresenceCheck
               (Formatter *format,FieldDescriptor *field,
               vector<int,_std::allocator<int>_> *has_bit_indices,Printer *printer,
               int *cached_has_word_index)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  Hex HVar4;
  AlphaNum local_70;
  undefined1 local_40 [8];
  string mask;
  
  if (*(char *)(*(long *)(field + 0x78) + 0x4f) == '\0') {
    if (field[0x43] == (FieldDescriptor)0x0) {
      plVar3 = (long *)(*(long *)(field + 0x50) + 0x28);
    }
    else if (*(long *)(field + 0x60) == 0) {
      plVar3 = (long *)(*(long *)(field + 0x28) + 0x80);
    }
    else {
      plVar3 = (long *)(*(long *)(field + 0x60) + 0x50);
    }
    iVar1 = *(int *)((long)&(has_bit_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                            .super__Vector_impl_data._M_start +
                    (long)((int)((ulong)((long)field - *plVar3) >> 3) * 0x286bca1b) * 4);
    iVar2 = iVar1 + 0x1f;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    if (*(int *)printer != iVar2 >> 5) {
      *(int *)printer = iVar2 >> 5;
      Formatter::operator()(format,"cached_has_bits = _has_bits_[$1$];\n",(int *)printer);
    }
    HVar4.value = 1L << ((byte)iVar1 & 0x1f);
    HVar4._8_8_ = 8;
    google::protobuf::strings::AlphaNum::AlphaNum(&local_70,HVar4);
    local_40 = (undefined1  [8])&mask._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,local_70.piece_data_,
               (undefined1 *)((long)local_70.piece_data_ + local_70.piece_size_));
    Formatter::operator()
              (format,"if (cached_has_bits & 0x$1$u) {\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    local_70.piece_data_ = (char *)local_40;
    if (local_40 == (undefined1  [8])&mask._M_string_length) goto LAB_001e8066;
  }
  else {
    FieldName_abi_cxx11_((string *)&local_70,(cpp *)field,(FieldDescriptor *)has_bit_indices);
    Formatter::operator()
              (format,"if (has_$1$()) {\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
    if (local_70.piece_data_ == local_70.digits) goto LAB_001e8066;
  }
  operator_delete(local_70.piece_data_);
LAB_001e8066:
  google::protobuf::io::Printer::Indent();
  return;
}

Assistant:

void PrintPresenceCheck(const Formatter& format, const FieldDescriptor* field,
                        const std::vector<int>& has_bit_indices,
                        io::Printer* printer, int* cached_has_word_index) {
  if (!field->options().weak()) {
    int has_bit_index = has_bit_indices[field->index()];
    if (*cached_has_word_index != (has_bit_index / 32)) {
      *cached_has_word_index = (has_bit_index / 32);
      format("cached_has_bits = _has_bits_[$1$];\n", *cached_has_word_index);
    }
    const std::string mask =
        StrCat(strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
    format("if (cached_has_bits & 0x$1$u) {\n", mask);
  } else {
    format("if (has_$1$()) {\n", FieldName(field));
  }
  format.Indent();
}